

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack2_16(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  
  auVar4 = vpbroadcastd_avx512f(ZEXT416(*in));
  auVar3 = vpsrlvd_avx2(auVar4._0_32_,_DAT_001a10a0);
  auVar1 = vpsrlvd_avx2(auVar4._0_16_,_DAT_001a1ce0);
  auVar2 = vpsrlvd_avx2(auVar4._0_16_,_DAT_001a6360);
  auVar5 = vpmovsxbd_avx512f(_DAT_00198510);
  auVar5 = vpermi2d_avx512f(auVar5,ZEXT3264(auVar3),auVar4);
  auVar6 = vpmovsxbd_avx512f(_DAT_00198520);
  auVar5 = vpermi2d_avx512f(auVar6,auVar5,ZEXT1664(auVar1));
  auVar6 = vpmovsxbd_avx512f(_DAT_001984f0);
  auVar6 = vpermi2d_avx512f(auVar6,auVar5,ZEXT1664(auVar2));
  auVar5._8_4_ = 3;
  auVar5._0_8_ = 0x300000003;
  auVar5._12_4_ = 3;
  auVar5._16_4_ = 3;
  auVar5._20_4_ = 3;
  auVar5._24_4_ = 3;
  auVar5._28_4_ = 3;
  auVar5._32_4_ = 3;
  auVar5._36_4_ = 3;
  auVar5._40_4_ = 3;
  auVar5._44_4_ = 3;
  auVar5._48_4_ = 3;
  auVar5._52_4_ = 3;
  auVar5._56_4_ = 3;
  auVar5._60_4_ = 3;
  auVar5 = vpandd_avx512f(auVar6,auVar5);
  auVar4 = vpsrld_avx512f(auVar4,0x1e);
  auVar4._0_60_ = auVar5._0_60_;
  auVar5 = vmovdqu64_avx512f(auVar4);
  *(undefined1 (*) [64])out = auVar5;
  return in + 1;
}

Assistant:

const uint32_t *__fastunpack2_16(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 2);
  out++;
  *out = ((*in) >> 2) % (1U << 2);
  out++;
  *out = ((*in) >> 4) % (1U << 2);
  out++;
  *out = ((*in) >> 6) % (1U << 2);
  out++;
  *out = ((*in) >> 8) % (1U << 2);
  out++;
  *out = ((*in) >> 10) % (1U << 2);
  out++;
  *out = ((*in) >> 12) % (1U << 2);
  out++;
  *out = ((*in) >> 14) % (1U << 2);
  out++;
  *out = ((*in) >> 16) % (1U << 2);
  out++;
  *out = ((*in) >> 18) % (1U << 2);
  out++;
  *out = ((*in) >> 20) % (1U << 2);
  out++;
  *out = ((*in) >> 22) % (1U << 2);
  out++;
  *out = ((*in) >> 24) % (1U << 2);
  out++;
  *out = ((*in) >> 26) % (1U << 2);
  out++;
  *out = ((*in) >> 28) % (1U << 2);
  out++;
  *out = ((*in) >> 30);
  ++in;
  out++;

  return in;
}